

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

bool __thiscall cmCTestP4::LoadRevisions(cmCTestP4 *this)

{
  cmCTest *this_00;
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  char *pcVar5;
  pointer __x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p4_changes;
  string local_968;
  string range;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p4_describe;
  string local_910;
  OutputLogger err;
  OutputLogger errDescribe;
  ChangesParser out;
  ostringstream cmCTestLog_msg;
  
  p4_changes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p4_changes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p4_changes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetP4Options(this,&p4_changes);
  std::operator+(&range,&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/...");
  bVar2 = std::operator==(&(this->super_cmCTestGlobalVC).OldRevision,"<unknown>");
  if (!bVar2) {
    bVar2 = std::operator==(&(this->super_cmCTestGlobalVC).NewRevision,"<unknown>");
    if (!bVar2) {
      psVar4 = (string *)std::__cxx11::string::append((char *)&range);
      pcVar5 = (char *)std::__cxx11::string::append(psVar4);
      psVar4 = (string *)std::__cxx11::string::append(pcVar5);
      std::__cxx11::string::append(psVar4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[8]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&p4_changes,
                 (char (*) [8])"changes");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&p4_changes,&range);
      ChangesParser::ChangesParser(&out,this,"p4_changes-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_changes-err> ");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->ChangeLists);
      local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
      local_910._M_string_length = 0;
      local_910.field_2._M_local_buf[0] = '\0';
      cmCTestVC::RunChild((cmCTestVC *)this,&p4_changes,(OutputParser *)&out,(OutputParser *)&err,
                          &local_910,Auto);
      std::__cxx11::string::~string((string *)&local_910);
      pbVar1 = (this->ChangeLists).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __x = (this->ChangeLists).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar1 != __x) {
        p4_describe.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        p4_describe.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        p4_describe.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while (__x != pbVar1) {
          SetP4Options(this,&p4_describe);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[9]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &p4_describe,(char (*) [9])"describe");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[3]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &p4_describe,(char (*) [3])"-s");
          __x = __x + -1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&p4_describe,__x);
          DescribeParser::DescribeParser((DescribeParser *)&cmCTestLog_msg,this,"p4_describe-out> ")
          ;
          cmProcessTools::OutputLogger::OutputLogger
                    ((OutputLogger *)&errDescribe.super_LineParser,
                     (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_describe-err> ");
          local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
          local_968._M_string_length = 0;
          local_968.field_2._M_local_buf[0] = '\0';
          cmCTestVC::RunChild((cmCTestVC *)this,&p4_describe,(OutputParser *)&cmCTestLog_msg,
                              &errDescribe.super_LineParser.super_OutputParser,&local_968,Auto);
          std::__cxx11::string::~string((string *)&local_968);
          cmProcessTools::LineParser::~LineParser(&errDescribe.super_LineParser);
          DescribeParser::~DescribeParser((DescribeParser *)&cmCTestLog_msg);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&p4_describe);
      }
      cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
      ChangesParser::~ChangesParser(&out);
      bVar2 = true;
      goto LAB_001fa0ff;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   At least one of the revisions ");
  std::operator<<(poVar3,"is unknown. No repository changes will be reported.\n");
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestP4.cxx"
               ,0x18d,(char *)out.super_LineParser.super_OutputParser._vptr_OutputParser,false);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar2 = false;
LAB_001fa0ff:
  std::__cxx11::string::~string((string *)&range);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&p4_changes);
  return bVar2;
}

Assistant:

bool cmCTestP4::LoadRevisions()
{
  std::vector<std::string> p4_changes;
  this->SetP4Options(p4_changes);

  // Use 'p4 changes ...@old,new' to get a list of changelists
  std::string range = this->SourceDirectory + "/...";

  // If any revision is unknown it means we couldn't contact the server.
  // Do not process updates
  if (this->OldRevision == "<unknown>" || this->NewRevision == "<unknown>") {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   At least one of the revisions "
                 << "is unknown. No repository changes will be reported.\n");
    return false;
  }

  range.append("@")
    .append(this->OldRevision)
    .append(",")
    .append(this->NewRevision);

  p4_changes.emplace_back("changes");
  p4_changes.push_back(range);

  ChangesParser out(this, "p4_changes-out> ");
  OutputLogger err(this->Log, "p4_changes-err> ");

  this->ChangeLists.clear();
  this->RunChild(p4_changes, &out, &err);

  if (this->ChangeLists.empty()) {
    return true;
  }

  // p4 describe -s ...@1111111,2222222
  std::vector<std::string> p4_describe;
  for (std::string const& i : cmReverseRange(this->ChangeLists)) {
    this->SetP4Options(p4_describe);
    p4_describe.emplace_back("describe");
    p4_describe.emplace_back("-s");
    p4_describe.push_back(i);

    DescribeParser outDescribe(this, "p4_describe-out> ");
    OutputLogger errDescribe(this->Log, "p4_describe-err> ");
    this->RunChild(p4_describe, &outDescribe, &errDescribe);
  }
  return true;
}